

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O1

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  bool bVar1;
  char *__nptr;
  size_t sVar2;
  ulong elementCount;
  anon_union_32_1_a8c68091_for_NullableValue<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_2
  *paVar3;
  char *pcVar4;
  double dVar5;
  char buf_stack [128];
  char *local_c8;
  undefined8 *local_c0;
  char local_b8 [136];
  
  sVar2 = digits->size_ + (fraction->ptr).field_1.value.size_ + 1;
  if ((fraction->ptr).isSet == false) {
    sVar2 = digits->size_;
  }
  if ((exponent->ptr).isSet == true) {
    sVar2 = sVar2 + *(long *)((long)&(exponent->ptr).field_1 + 0x10) +
            (ulong)(exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value
                   .ptr.isSet + 1;
  }
  elementCount = sVar2 + 1;
  if (elementCount < 0x81) {
    local_c8 = (char *)0x0;
    __nptr = local_b8;
    elementCount = 0;
    local_c0 = (undefined8 *)0x0;
  }
  else {
    __nptr = (char *)kj::_::HeapArrayDisposer::allocateImpl
                               (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    local_c0 = &kj::_::HeapArrayDisposer::instance;
    local_c8 = __nptr;
  }
  memcpy(__nptr,digits->ptr,digits->size_);
  pcVar4 = __nptr + digits->size_;
  if ((fraction->ptr).isSet == true) {
    *pcVar4 = '.';
    memcpy(pcVar4 + 1,(fraction->ptr).field_1.value.ptr,(fraction->ptr).field_1.value.size_);
    pcVar4 = pcVar4 + 1 + (fraction->ptr).field_1.value.size_;
  }
  bVar1 = (exponent->ptr).isSet;
  paVar3 = (anon_union_32_1_a8c68091_for_NullableValue<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_2
            *)0x0;
  if (bVar1 != false) {
    paVar3 = &(exponent->ptr).field_1;
  }
  if (bVar1 == true) {
    *pcVar4 = 'e';
    if ((paVar3->value).impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet == true) {
      *(anon_union_1_1_a8c68091_for_NullableValue<char>_2 *)(pcVar4 + 1) =
           (paVar3->value).impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.field_1;
      pcVar4 = pcVar4 + 2;
    }
    else {
      pcVar4 = pcVar4 + 1;
    }
    memcpy(pcVar4,*(void **)((long)paVar3 + 8),*(size_t *)((long)paVar3 + 0x10));
    pcVar4 = pcVar4 + *(long *)((long)paVar3 + 0x10);
  }
  *pcVar4 = '\0';
  dVar5 = strtod(__nptr,(char **)0x0);
  if (local_c8 != (char *)0x0) {
    (**(code **)*local_c0)(local_c0,local_c8,1,elementCount,elementCount,0);
  }
  return dVar5;
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_MAYBE(f, fraction) {
    bufSize += 1 + f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    bufSize += 1 + (get<0>(*e) != nullptr) + get<1>(*e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_MAYBE(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f->begin(), f->size());
    pos += f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    *pos++ = 'e';
    KJ_IF_MAYBE(sign, get<0>(*e)) {
      *pos++ = *sign;
    }
    memcpy(pos, get<1>(*e).begin(), get<1>(*e).size());
    pos += get<1>(*e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  return strtod(buf.begin(), nullptr);
}